

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Control.cpp
# Opt level: O3

void __thiscall Control::begin(Control *this)

{
  time_t tVar1;
  long lVar2;
  GameData *pGVar3;
  undefined8 *puVar4;
  byte bVar5;
  Draw DrawUi;
  GameOperator Operator;
  GameData Data;
  Draw local_105;
  GameOperator local_104;
  undefined8 local_100 [9];
  int local_b8;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  int local_90;
  GameData local_88;
  
  bVar5 = 0;
  Draw::Draw(&local_105);
  GameData::GameData(&local_88);
  GameOperator::GameOperator(&local_104);
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  pGVar3 = &local_88;
  puVar4 = local_100;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar4 = *(undefined8 *)pGVar3;
    pGVar3 = (GameData *)((long)pGVar3 + ((ulong)bVar5 * -2 + 1) * 8);
    puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
  }
  local_b8 = local_88.my_best;
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b0,local_88.local_name._M_dataplus._M_p,
             local_88.local_name._M_dataplus._M_p + local_88.local_name._M_string_length);
  local_90 = local_88.local_best;
  loop();
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.local_name._M_dataplus._M_p != &local_88.local_name.field_2) {
    operator_delete(local_88.local_name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Control::begin() {
    Draw DrawUi;
    GameData Data;
    GameOperator Operator;
    srand((unsigned) time(NULL));
    loop(Data, DrawUi, Operator);
}